

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O1

void __thiscall Psbt_UsecaseTest2_Test::~Psbt_UsecaseTest2_Test(Psbt_UsecaseTest2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Psbt, UsecaseTest2) {
  static const std::string seed1 = "8bc106907003ea0b55f3ed4ce2fcf9a198d8c43f07e6ade8aacc5c20c33db12e";
  static const std::string seed2 = "d3e3539eafb6af1f0ae374ecffd33bed394f5eb2e39f8957be63c258ac32ca97";

  NetType net_type = NetType::kRegtest;
  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/1/100";
  auto change_key1 = wallet1.GeneratePubkeyData(net_type, path1);
  std::string change_descriptor1 = "wpkh(" + change_key1.ToString() + ")";
  Descriptor change_desc1 = Descriptor::Parse(change_descriptor1);
  EXPECT_STREQ("wpkh([2a704760/44'/0'/0'/1/100]02f7f0d7d00289b7c5a581bc35276040c348de48fc414067f31ea26ad95c00550c)", change_descriptor1.c_str());

  std::vector<Privkey> privkey_list1;
  auto utxo_list1 = CfdTestGenerateUtxo(
    net_type, wallet1, "44h/0h/0h/1", Amount(10000000), 1, 11, &privkey_list1);
  std::vector<Privkey> privkey_list2;
  auto utxo_list2 = CfdTestGenerateUtxo(
    net_type, wallet2, "44h/0h/0h/1", Amount(50000000), 1, 3, &privkey_list2);

  Psbt psbt;
  std::string out_path1 = "44h/0h/0h/0/2";
  std::string out_path2 = "44h/0h/0h/0/2";
  auto out_key1 = wallet1.GeneratePubkeyData(net_type, out_path1);
  auto out_key2 = wallet2.GeneratePubkeyData(net_type, out_path2);
  auto out_addr1 = Address(NetType::kTestnet, WitnessVersion::kVersion0, out_key1.GetPubkey());
  auto out_addr2 = Address(NetType::kTestnet, WitnessVersion::kVersion0, out_key2.GetPubkey());

  // Creator
  // add txout (0.5btc * 2)
  Amount amount(50000000);
  try {
    psbt.AddTxOutData(amount, out_addr1, out_key1);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
  try {
    psbt.AddTxOutData(amount, out_addr2, out_key2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  // Updater
  // add txin
  Psbt psbt1;
  Psbt psbt2;
  uint32_t use_utxo1_count = 5;
  try {
    psbt1 = psbt;
    for (uint32_t index=0; index<use_utxo1_count; ++index) {
      psbt1.AddTxInData(utxo_list1[index]);
    }
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt2 = psbt;
    psbt2.AddTxInData(utxo_list2[0]);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt.Join(psbt1);
    EXPECT_EQ(5, psbt.GetTxInCount());
    EXPECT_EQ(10000000, psbt.GetUtxoData(0).amount.GetSatoshiValue());
    EXPECT_EQ(10000000, psbt.GetUtxoData(4).amount.GetSatoshiValue());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }
  try {
    psbt.Join(psbt2);
    EXPECT_EQ(50000000, psbt.GetUtxoData(5).amount.GetSatoshiValue());
    EXPECT_EQ(utxo_list2[0].amount.GetSatoshiValue(), psbt.GetUtxoData(5).amount.GetSatoshiValue());
    EXPECT_EQ(utxo_list2[0].txid.GetHex(), psbt.GetUtxoData(5).txid.GetHex());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  // 70736274ff0100fd3e010200000006f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff0280f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c000080000000800000008001000000010000000001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca822206022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b182a7047602c000080000000800000008001000000020000000001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e220602e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855182a7047602c000080000000800000008001000000030000000001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb0752206033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44182a7047602c000080000000800000008001000000040000000001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d6700779220602fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504182a7047602c000080000000800000008001000000050000000001011f80f0fa0200000000160014978a90460e44671a52f49a09bb59cc6794b63c89220603e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec189d6b6d862c0000800000008000000080010000000100000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000
  EXPECT_STREQ("cHNidP8BAP0+AQIAAAAG+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////AoDw+gIAAAAAFgAUsyK93OYzuFGsc3CrRU8LNnoGVOWA8PoCAAAAABYAFMq4xTpuj8ApbRzTkVowfVHEkaVVAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAAiAgNHO/yMdwwbIgoueq5LrfbA1+rykCjVsp00OAErsonvgRgqcEdgLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==", psbt.GetBase64().c_str());

  // Updater (for fee)
  std::vector<UtxoData> selected_utxos;
  std::vector<Privkey> target_privkey_list1;
  try {
    Amount fee;
    std::vector<UtxoData> selection_utxo;
    std::copy(utxo_list1.begin() + use_utxo1_count + 1, utxo_list1.end(),
        std::back_inserter(selection_utxo));
    CoinSelectionOption option;
    option.SetEffectiveFeeBaserate(2.0);
    option.SetKnapsackMinimumChange(0);
    EXPECT_EQ(5, selection_utxo.size());
    EXPECT_EQ(10000000, selection_utxo[0].amount.GetSatoshiValue());
    EXPECT_EQ(6, psbt.GetTxInCount());

    EXPECT_STREQ("8b3a1f738009f99fd8b01e1ad95c5468e8fb25d5373df19697d78eec957c423c", selection_utxo[0].txid.GetHex().c_str());
    EXPECT_EQ(7, selection_utxo[0].vout);
    EXPECT_STREQ("wpkh([2a704760/44'/0'/0'/1/7]03c02325c328fed622a9d88f8f5318e05261a3c3a967b7211d7d67657e2b5e9fbe)", selection_utxo[0].descriptor.c_str());
    EXPECT_STREQ("0e5b0e16148da878ee8d9f0524ac0962a22dbbb66e2dc8a6237a1d4c8c4ea9cb", selection_utxo[1].txid.GetHex().c_str());
    EXPECT_EQ(8, selection_utxo[1].vout);
    EXPECT_STREQ("wpkh([2a704760/44'/0'/0'/1/8]02f505e0b5885959bd2f7e68dd73915940a5540e05c41a42f6c598ceb21bdc55f3)", selection_utxo[1].descriptor.c_str());
    EXPECT_STREQ("016b36a0a9df54d55f7b907aba8fdd3d90d797eee2bc46c5ed7dced41218e674", selection_utxo[2].txid.GetHex().c_str());
    EXPECT_EQ(9, selection_utxo[2].vout);
    EXPECT_STREQ("wpkh([2a704760/44'/0'/0'/1/9]02f7af7e1c3c8627e0e662ba04ec003879d9aeaeba5a02a1e24804ef4d7b497db4)", selection_utxo[2].descriptor.c_str());
    EXPECT_STREQ("dcc65ebfb8535f96f8a51e07d5c0a94f965000bd5765159a3cc27e4edd658c69", selection_utxo[3].txid.GetHex().c_str());
    EXPECT_EQ(10, selection_utxo[3].vout);
    EXPECT_STREQ("wpkh([2a704760/44'/0'/0'/1/10]03c04e76f9bc7d6433a6eb7c0c3c446213c5f361dae22929483f23718e1cee4ece)", selection_utxo[3].descriptor.c_str());
    EXPECT_STREQ("0230e7471501f9432f727583f2bc17c11f5c1132140319ba2d7a5a0145684c73", selection_utxo[4].txid.GetHex().c_str());
    EXPECT_EQ(11, selection_utxo[4].vout);
    EXPECT_STREQ("wpkh([2a704760/44'/0'/0'/1/11]03798ff13e5d17c6f8c1d69ff18d516613be2fa52149b3a8c60ef959d1075a5889)", selection_utxo[4].descriptor.c_str());

    selected_utxos = psbt.FundTransaction(selection_utxo, 2.0,
        &change_desc1, &fee, &option);
    EXPECT_EQ(fee.GetSatoshiValue(), 1166);
    
    for (uint32_t index=0; index<use_utxo1_count; ++index) {
      target_privkey_list1.push_back(privkey_list1[index]);
    }
    for (const auto& select_utxo : selected_utxos) {
      for (size_t index=use_utxo1_count; index<utxo_list1.size(); ++index) {
        if ((select_utxo.vout == utxo_list1[index].vout) &&
            select_utxo.txid.Equals(utxo_list1[index].txid)) {
          target_privkey_list1.push_back(privkey_list1[index]);
        }
      }
    }
    EXPECT_STREQ("cHNidP8BAP2GAQIAAAAH+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////PEJ8leyO15eW8T031SX76GhUXNkaHrDYn/kJgHMfOosHAAAAAP////8DgPD6AgAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5YDw+gIAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVXykZgAAAAAABYAFCtuFro44oBQD4CyxXBu8C841ZCBAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAABAR+AlpgAAAAAABYAFBzoeOOg2js0MIeX/ey3YiH4VBivIgYDwCMlwyj+1iKp2I+PUxjgUmGjw6lntyEdfWdlfiten74YKnBHYCwAAIAAAACAAAAAgAEAAAAHAAAAACICA0c7/Ix3DBsiCi56rkut9sDX6vKQKNWynTQ4ASuyie+BGCpwR2AsAACAAAAAgAAAAIAAAAAAAgAAAAAiAgNkdK/yYzw1GGVTn7UrYrnW+55OI1dmKOHwoKeZNFjgbBida22GLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIC9/DX0AKJt8Wlgbw1J2BAw0jeSPxBQGfzHqJq2VwAVQwYKnBHYCwAAIAAAACAAAAAgAEAAABkAAAAAA==", psbt.GetBase64().c_str());

  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  // Signer
  try {
    psbt1 = psbt;
    for (const auto& privkey : privkey_list1) {
      psbt1.Sign(privkey);
    }
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }
  try {
    psbt2 = psbt;
    psbt2.Sign(privkey_list2[0]);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  // Combiner
  try {
    psbt.Combine(psbt1);
    psbt.Combine(psbt2);
    EXPECT_STREQ("70736274ff0100fd86010200000007f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff3c427c95ec8ed79796f13d37d525fbe868545cd91a1eb0d89ff90980731f3a8b0700000000ffffffff0380f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555f2919800000000001600142b6e16ba38e280500f80b2c5706ef02f38d59081000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae1040470520220202565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe473044022016d6be246613d8f20a98f79651ba6402352478bde005ba292adee40c3060f97a022061e5e264be9a892f4579bcbcd5c660405d3b95adb807c8b54caf3dc22f75f9fd01220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c000080000000800000008001000000010000000001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca822202022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b4730440220622277094f292704dfbcd95c951b95f83f8ae85b0584d0a6058548a7a0ae814e02200b913ac3fcce9780911e927997442af8de0945f03a9576a2c300bdebe08c6182012206022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b182a7047602c000080000000800000008001000000020000000001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e220202e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d1385547304402202dc3146d944ac124e6964730524e73b3600ce84ec4c286cbcccfe7eb25cfb2a30220701661116a179ce213c14280073253c3467ef8e8a7324618ac263e337046b3a601220602e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855182a7047602c000080000000800000008001000000030000000001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb0752202033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44473044022062b755ad1f11cd001bb9744788c4db87d90253d337f37048cb29529eacd854050220483bbc41077c7a31cbaf7dc02acad05e28e42d2a3224c99cfb31064fa21015b0012206033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44182a7047602c000080000000800000008001000000040000000001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d6700779220202fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504473044022065ef50669cb7804a837b11c727f8a4891de3b408544c5b817fed41b3a2cdbd67022046b380b373c2368ffdce73a9b2b0f634ef83915aea9e677133caeae861a24f8801220602fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504182a7047602c000080000000800000008001000000050000000001011f80f0fa0200000000160014978a90460e44671a52f49a09bb59cc6794b63c89220203e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec4730440220779520daeb0ae58727df2578543ce32a060ed74eca86c44820e52acec43013d10220097b0815506262bf9728276db3aa227834959187455dc3f191f9fe80aa30955201220603e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec189d6b6d862c000080000000800000008001000000010000000001011f80969800000000001600141ce878e3a0da3b34308797fdecb76221f85418af220203c02325c328fed622a9d88f8f5318e05261a3c3a967b7211d7d67657e2b5e9fbe47304402200fd024910c6207d2679ad1b9bb0ed8c0ff8d55aa603ef7c499917da20a3f417a0220086dfa0cce871385e24da90b7e20f5f1e1f9f7d707c5562bcfa66a855d7d220801220603c02325c328fed622a9d88f8f5318e05261a3c3a967b7211d7d67657e2b5e9fbe182a7047602c0000800000008000000080010000000700000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000220202f7f0d7d00289b7c5a581bc35276040c348de48fc414067f31ea26ad95c00550c182a7047602c0000800000008000000080010000006400000000", psbt.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAP2GAQIAAAAH+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////PEJ8leyO15eW8T031SX76GhUXNkaHrDYn/kJgHMfOosHAAAAAP////8DgPD6AgAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5YDw+gIAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVXykZgAAAAAABYAFCtuFro44oBQD4CyxXBu8C841ZCBAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgICVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv5HMEQCIBbWviRmE9jyCpj3llG6ZAI1JHi94AW6KSre5AwwYPl6AiBh5eJkvpqJL0V5vLzVxmBAXTuVrbgHyLVMrz3CL3X5/QEiBgJWUkhGCzwYbezxPbBvByT9ULR8w+SJwwB2yDY9UDjO/hgqcEdgLAAAgAAAAIAAAACAAQAAAAEAAAAAAQEfgJaYAAAAAAAWABSL8J1gt+NPNIJ9jbyxx2OQqRbKgiICAidEz7JDbhVgQOwcj+hC2e+aGMtArUHzEnJTkMNfe9NrRzBEAiBiIncJTyknBN+82VyVG5X4P4roWwWE0KYFhUinoK6BTgIgC5E6w/zOl4CRHpJ5l0Qq+N4JRfA6lXaiwwC96+CMYYIBIgYCJ0TPskNuFWBA7ByP6ELZ75oYy0CtQfMSclOQw19702sYKnBHYCwAAIAAAACAAAAAgAEAAAACAAAAAAEBH4CWmAAAAAAAFgAU8dPuZ4KSJeuJLMqwHiL2p3fn4h4iAgLn6Nwjb6AkNpQI0s5NhQgEgmGrwpe4EWBNoIetcdE4VUcwRAIgLcMUbZRKwSTmlkcwUk5zs2AM6E7EwobLzM/n6yXPsqMCIHAWYRFqF5ziE8FCgAcyU8NGfvjopzJGGKwmPjNwRrOmASIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgIDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20RHMEQCIGK3Va0fEc0AG7l0R4jE24fZAlPTN/NwSMspUp6s2FQFAiBIO7xBB3x6McuvfcAqytBeKOQtKjIkyZz7MQZPohAVsAEiBgM9h0vxm2l89sY5ZZVHpYO4ZzAWSlttsBvyChTrm2rbRBgqcEdgLAAAgAAAAIAAAACAAQAAAAQAAAAAAQEfgJaYAAAAAAAWABQSt5VKde/Cog6G4y3C14ZH1nAHeSICAvsGFzDb3jyAa0oXqZ9FTIEoKuzubUb0qXWpTN/ToGUERzBEAiBl71BmnLeASoN7Eccn+KSJHeO0CFRMW4F/7UGzos29ZwIgRrOAs3PCNo/9znOpsrD2NO+DkVrqnmdxM8rq6GGiT4gBIgYC+wYXMNvePIBrShepn0VMgSgq7O5tRvSpdalM39OgZQQYKnBHYCwAAIAAAACAAAAAgAEAAAAFAAAAAAEBH4Dw+gIAAAAAFgAUl4qQRg5EZxpS9JoJu1nMZ5S2PIkiAgPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7EcwRAIgd5Ug2usK5Ycn3yV4VDzjKgYO107KhsRIIOUqzsQwE9ECIAl7CBVQYmK/lygnbbOqIng0lZGHRV3D8ZH5/oCqMJVSASIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAABAR+AlpgAAAAAABYAFBzoeOOg2js0MIeX/ey3YiH4VBivIgIDwCMlwyj+1iKp2I+PUxjgUmGjw6lntyEdfWdlfiten75HMEQCIA/QJJEMYgfSZ5rRubsO2MD/jVWqYD73xJmRfaIKP0F6AiAIbfoMzocTheJNqQt+IPXx4fn31wfFVivPpmqFXX0iCAEiBgPAIyXDKP7WIqnYj49TGOBSYaPDqWe3IR19Z2V+K16fvhgqcEdgLAAAgAAAAIAAAACAAQAAAAcAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAAiAgL38NfQAom3xaWBvDUnYEDDSN5I/EFAZ/MeomrZXABVDBgqcEdgLAAAgAAAAIAAAACAAQAAAGQAAAAA", psbt.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  // Input Finalizer
  try {
    EXPECT_FALSE(psbt.IsFinalized());
    OutPoint outpoint1(utxo_list1[0].txid, utxo_list1[0].vout);
    EXPECT_FALSE(psbt.IsFinalizedInput(outpoint1));
    psbt.Finalize();
    EXPECT_TRUE(psbt.IsFinalizedInput(outpoint1));
    EXPECT_STREQ("70736274ff0100fd86010200000007f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff3c427c95ec8ed79796f13d37d525fbe868545cd91a1eb0d89ff90980731f3a8b0700000000ffffffff0380f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555f2919800000000001600142b6e16ba38e280500f80b2c5706ef02f38d59081000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae104047052001086b02473044022016d6be246613d8f20a98f79651ba6402352478bde005ba292adee40c3060f97a022061e5e264be9a892f4579bcbcd5c660405d3b95adb807c8b54caf3dc22f75f9fd012102565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe0001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca8201086b024730440220622277094f292704dfbcd95c951b95f83f8ae85b0584d0a6058548a7a0ae814e02200b913ac3fcce9780911e927997442af8de0945f03a9576a2c300bdebe08c61820121022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b0001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e01086b0247304402202dc3146d944ac124e6964730524e73b3600ce84ec4c286cbcccfe7eb25cfb2a30220701661116a179ce213c14280073253c3467ef8e8a7324618ac263e337046b3a6012102e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d138550001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb07501086b02473044022062b755ad1f11cd001bb9744788c4db87d90253d337f37048cb29529eacd854050220483bbc41077c7a31cbaf7dc02acad05e28e42d2a3224c99cfb31064fa21015b00121033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb440001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d670077901086b02473044022065ef50669cb7804a837b11c727f8a4891de3b408544c5b817fed41b3a2cdbd67022046b380b373c2368ffdce73a9b2b0f634ef83915aea9e677133caeae861a24f88012102fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a065040001011f80f0fa0200000000160014978a90460e44671a52f49a09bb59cc6794b63c8901086b024730440220779520daeb0ae58727df2578543ce32a060ed74eca86c44820e52acec43013d10220097b0815506262bf9728276db3aa227834959187455dc3f191f9fe80aa309552012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec0001011f80969800000000001600141ce878e3a0da3b34308797fdecb76221f85418af01086b0247304402200fd024910c6207d2679ad1b9bb0ed8c0ff8d55aa603ef7c499917da20a3f417a0220086dfa0cce871385e24da90b7e20f5f1e1f9f7d707c5562bcfa66a855d7d2208012103c02325c328fed622a9d88f8f5318e05261a3c3a967b7211d7d67657e2b5e9fbe00220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000220202f7f0d7d00289b7c5a581bc35276040c348de48fc414067f31ea26ad95c00550c182a7047602c0000800000008000000080010000006400000000", psbt.GetData().GetHex().c_str());

    psbt.Verify();
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  // Transaction Extractor
  try {
    EXPECT_TRUE(psbt.IsFinalized());
    EXPECT_EQ(psbt.GetFeeAmount().GetSatoshiValue(), 1166);
    auto tx = psbt.ExtractTransaction();
    EXPECT_STREQ("02000000000107f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff3c427c95ec8ed79796f13d37d525fbe868545cd91a1eb0d89ff90980731f3a8b0700000000ffffffff0380f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555f2919800000000001600142b6e16ba38e280500f80b2c5706ef02f38d5908102473044022016d6be246613d8f20a98f79651ba6402352478bde005ba292adee40c3060f97a022061e5e264be9a892f4579bcbcd5c660405d3b95adb807c8b54caf3dc22f75f9fd012102565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe024730440220622277094f292704dfbcd95c951b95f83f8ae85b0584d0a6058548a7a0ae814e02200b913ac3fcce9780911e927997442af8de0945f03a9576a2c300bdebe08c61820121022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b0247304402202dc3146d944ac124e6964730524e73b3600ce84ec4c286cbcccfe7eb25cfb2a30220701661116a179ce213c14280073253c3467ef8e8a7324618ac263e337046b3a6012102e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d1385502473044022062b755ad1f11cd001bb9744788c4db87d90253d337f37048cb29529eacd854050220483bbc41077c7a31cbaf7dc02acad05e28e42d2a3224c99cfb31064fa21015b00121033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb4402473044022065ef50669cb7804a837b11c727f8a4891de3b408544c5b817fed41b3a2cdbd67022046b380b373c2368ffdce73a9b2b0f634ef83915aea9e677133caeae861a24f88012102fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504024730440220779520daeb0ae58727df2578543ce32a060ed74eca86c44820e52acec43013d10220097b0815506262bf9728276db3aa227834959187455dc3f191f9fe80aa309552012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec0247304402200fd024910c6207d2679ad1b9bb0ed8c0ff8d55aa603ef7c499917da20a3f417a0220086dfa0cce871385e24da90b7e20f5f1e1f9f7d707c5562bcfa66a855d7d2208012103c02325c328fed622a9d88f8f5318e05261a3c3a967b7211d7d67657e2b5e9fbe00000000", tx.GetHex().c_str());

    TransactionContext context(tx.GetHex());
    auto utxos = psbt.GetUtxoDataAll();
    EXPECT_EQ(10000000, utxos[0].amount.GetSatoshiValue());
    EXPECT_EQ(10000000, utxos[4].amount.GetSatoshiValue());
    EXPECT_STREQ("b98f570401eb46bded2d3efb41aba9090d014f083a0ad2d232c8229a4d1abea0", utxos[4].txid.GetHex().c_str());
    UtxoData utxo0 = utxos[0];
    UtxoData utxo4 = utxos[4];
    UtxoData utxo5 = utxos[5];
    context.CollectInputUtxo(utxos);
    context.Verify();

    auto sighash = context.GetSignatureHash(0, ByteData("76a914962c4e08f336d3afbc3415c9d359ae104047052088ac"), SigHashType(),
        utxos[0].amount, WitnessVersion::kVersion0);
    EXPECT_STREQ(
      "b330738168b0df580797fa0e5eba6287b16f7b881df208c7045008f0d193e2c1",
      sighash.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }
}